

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.h
# Opt level: O2

void __thiscall
embree::avx512::CurveGeometryInterface<embree::BezierCurveT>::interpolate_impl<4>
          (CurveGeometryInterface<embree::BezierCurveT> *this,RTCInterpolateArguments *args)

{
  int *piVar1;
  float *pfVar2;
  float fVar3;
  uint uVar4;
  uint uVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  char *pcVar9;
  byte bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined1 auVar22 [16];
  vector<BufferView<Vec3ff>_> *pvVar23;
  ulong uVar24;
  ulong uVar25;
  uint i;
  uint uVar26;
  ulong uVar27;
  ulong uVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  
  uVar4 = args->primID;
  fVar3 = args->u;
  pfVar6 = args->P;
  pfVar7 = args->dPdu;
  pfVar8 = args->ddPdudu;
  uVar5 = args->valueCount;
  pvVar23 = &(this->super_CurveGeometry).vertices;
  if (args->bufferType == RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE) {
    pvVar23 = (vector<BufferView<Vec3ff>_> *)&(this->super_CurveGeometry).vertexAttribs;
  }
  pcVar9 = pvVar23->items[args->bufferSlot].super_RawBufferView.ptr_ofs;
  uVar25 = (ulong)(uint)pvVar23->items[args->bufferSlot].super_RawBufferView.stride;
  auVar29 = vpbroadcastd_avx512vl();
  fVar21 = 1.0 - fVar3;
  fVar14 = fVar21 * fVar21;
  fVar15 = fVar21 * fVar14;
  fVar16 = fVar3 * 3.0 * fVar14;
  fVar17 = fVar3 * fVar3;
  fVar18 = fVar17 * 3.0;
  fVar19 = fVar21 * fVar18;
  fVar20 = fVar3 * fVar17;
  auVar35._4_4_ = fVar15;
  auVar35._0_4_ = fVar15;
  auVar35._8_4_ = fVar15;
  auVar35._12_4_ = fVar15;
  auVar36._4_4_ = fVar16;
  auVar36._0_4_ = fVar16;
  auVar36._8_4_ = fVar16;
  auVar36._12_4_ = fVar16;
  auVar37._4_4_ = fVar19;
  auVar37._0_4_ = fVar19;
  auVar37._8_4_ = fVar19;
  auVar37._12_4_ = fVar19;
  auVar38._4_4_ = fVar20;
  auVar38._0_4_ = fVar20;
  auVar38._8_4_ = fVar20;
  auVar38._12_4_ = fVar20;
  auVar44 = SUB6416(ZEXT464(0xc0000000),0);
  auVar43 = vfmsub231ss_fma(ZEXT416((uint)fVar17),ZEXT416((uint)(fVar3 * fVar21)),
                            ZEXT416(0x40000000));
  auVar22 = vfmadd213ss_fma(auVar44,ZEXT416((uint)(fVar3 * fVar21)),ZEXT416((uint)fVar14));
  fVar14 = fVar14 * -3.0;
  fVar15 = auVar22._0_4_ * 3.0;
  fVar16 = auVar43._0_4_ * 3.0;
  auVar39._4_4_ = fVar14;
  auVar39._0_4_ = fVar14;
  auVar39._8_4_ = fVar14;
  auVar39._12_4_ = fVar14;
  auVar40._4_4_ = fVar15;
  auVar40._0_4_ = fVar15;
  auVar40._8_4_ = fVar15;
  auVar40._12_4_ = fVar15;
  auVar41._4_4_ = fVar16;
  auVar41._0_4_ = fVar16;
  auVar41._8_4_ = fVar16;
  auVar41._12_4_ = fVar16;
  auVar42._4_4_ = fVar18;
  auVar42._0_4_ = fVar18;
  auVar42._8_4_ = fVar18;
  auVar42._12_4_ = fVar18;
  auVar22 = vfmadd213ss_fma(auVar44,ZEXT416((uint)fVar21),ZEXT416((uint)fVar3));
  auVar43 = vfmadd213ss_fma(auVar44,ZEXT416((uint)fVar3),ZEXT416((uint)fVar21));
  fVar21 = fVar21 * 6.0;
  fVar15 = auVar22._0_4_ * 6.0;
  fVar16 = auVar43._0_4_ * 6.0;
  fVar3 = fVar3 * 6.0;
  auVar43._4_4_ = fVar21;
  auVar43._0_4_ = fVar21;
  auVar43._8_4_ = fVar21;
  auVar43._12_4_ = fVar21;
  auVar44._4_4_ = fVar15;
  auVar44._0_4_ = fVar15;
  auVar44._8_4_ = fVar15;
  auVar44._12_4_ = fVar15;
  auVar45._4_4_ = fVar16;
  auVar45._0_4_ = fVar16;
  auVar45._8_4_ = fVar16;
  auVar45._12_4_ = fVar16;
  auVar46._4_4_ = fVar3;
  auVar46._0_4_ = fVar3;
  auVar46._8_4_ = fVar3;
  auVar46._12_4_ = fVar3;
  uVar26 = 0;
  auVar22 = vpmovsxbd_avx(ZEXT416(0x3020100));
  for (; uVar26 < uVar5; uVar26 = uVar26 + 4) {
    uVar27 = (ulong)*(uint *)(*(long *)&(this->super_CurveGeometry).super_Geometry.field_0x58 +
                             *(long *)&(this->super_CurveGeometry).field_0x68 * (ulong)uVar4);
    uVar24 = (ulong)uVar26;
    auVar30 = vpbroadcastd_avx512vl();
    auVar30 = vpor_avx(auVar30,auVar22);
    uVar28 = vpcmpgtd_avx512vl(auVar29,auVar30);
    uVar28 = uVar28 & 0xf;
    piVar1 = (int *)(pcVar9 + uVar24 * 4 + uVar25 * uVar27);
    bVar10 = (byte)uVar28;
    auVar30._4_4_ = (uint)((byte)(uVar28 >> 1) & 1) * piVar1[1];
    auVar30._0_4_ = (uint)(bVar10 & 1) * *piVar1;
    auVar30._8_4_ = (uint)((byte)(uVar28 >> 2) & 1) * piVar1[2];
    auVar30._12_4_ = (uint)(byte)(uVar28 >> 3) * piVar1[3];
    piVar1 = (int *)(pcVar9 + uVar24 * 4 + (uVar27 + 1) * uVar25);
    auVar34._4_4_ = (uint)((byte)(uVar28 >> 1) & 1) * piVar1[1];
    auVar34._0_4_ = (uint)(bVar10 & 1) * *piVar1;
    auVar34._8_4_ = (uint)((byte)(uVar28 >> 2) & 1) * piVar1[2];
    auVar34._12_4_ = (uint)(byte)(uVar28 >> 3) * piVar1[3];
    piVar1 = (int *)(pcVar9 + uVar24 * 4 + (uVar27 + 2) * uVar25);
    auVar33._4_4_ = (uint)((byte)(uVar28 >> 1) & 1) * piVar1[1];
    auVar33._0_4_ = (uint)(bVar10 & 1) * *piVar1;
    auVar33._8_4_ = (uint)((byte)(uVar28 >> 2) & 1) * piVar1[2];
    auVar33._12_4_ = (uint)(byte)(uVar28 >> 3) * piVar1[3];
    piVar1 = (int *)(pcVar9 + uVar24 * 4 + (uVar27 + 3) * uVar25);
    auVar32._4_4_ = (uint)((byte)(uVar28 >> 1) & 1) * piVar1[1];
    auVar32._0_4_ = (uint)(bVar10 & 1) * *piVar1;
    auVar32._8_4_ = (uint)((byte)(uVar28 >> 2) & 1) * piVar1[2];
    auVar32._12_4_ = (uint)(byte)(uVar28 >> 3) * piVar1[3];
    if (pfVar6 != (float *)0x0) {
      auVar31 = vmulps_avx512vl(auVar38,auVar32);
      auVar31 = vfmadd231ps_avx512vl(auVar31,auVar37,auVar33);
      auVar31 = vfmadd231ps_avx512vl(auVar31,auVar36,auVar34);
      auVar31 = vfmadd231ps_avx512vl(auVar31,auVar35,auVar30);
      pfVar2 = pfVar6 + uVar24;
      bVar11 = (bool)((byte)(uVar28 >> 1) & 1);
      bVar12 = (bool)((byte)(uVar28 >> 2) & 1);
      bVar13 = SUB81(uVar28 >> 3,0);
      *pfVar2 = (float)((uint)(bVar10 & 1) * auVar31._0_4_ |
                       (uint)!(bool)(bVar10 & 1) * (int)*pfVar2);
      pfVar2[1] = (float)((uint)bVar11 * auVar31._4_4_ | (uint)!bVar11 * (int)pfVar2[1]);
      pfVar2[2] = (float)((uint)bVar12 * auVar31._8_4_ | (uint)!bVar12 * (int)pfVar2[2]);
      pfVar2[3] = (float)((uint)bVar13 * auVar31._12_4_ | (uint)!bVar13 * (int)pfVar2[3]);
    }
    if (pfVar7 != (float *)0x0) {
      auVar31 = vmulps_avx512vl(auVar42,auVar32);
      auVar31 = vfmadd231ps_avx512vl(auVar31,auVar41,auVar33);
      auVar31 = vfmadd231ps_avx512vl(auVar31,auVar40,auVar34);
      auVar31 = vfmadd231ps_avx512vl(auVar31,auVar39,auVar30);
      pfVar2 = pfVar7 + uVar24;
      bVar11 = (bool)((byte)(uVar28 >> 1) & 1);
      bVar12 = (bool)((byte)(uVar28 >> 2) & 1);
      bVar13 = SUB81(uVar28 >> 3,0);
      *pfVar2 = (float)((uint)(bVar10 & 1) * auVar31._0_4_ |
                       (uint)!(bool)(bVar10 & 1) * (int)*pfVar2);
      pfVar2[1] = (float)((uint)bVar11 * auVar31._4_4_ | (uint)!bVar11 * (int)pfVar2[1]);
      pfVar2[2] = (float)((uint)bVar12 * auVar31._8_4_ | (uint)!bVar12 * (int)pfVar2[2]);
      pfVar2[3] = (float)((uint)bVar13 * auVar31._12_4_ | (uint)!bVar13 * (int)pfVar2[3]);
    }
    if (pfVar8 != (float *)0x0) {
      auVar32 = vmulps_avx512vl(auVar46,auVar32);
      auVar33 = vfmadd213ps_avx512vl(auVar33,auVar45,auVar32);
      auVar34 = vfmadd213ps_avx512vl(auVar34,auVar44,auVar33);
      auVar30 = vfmadd213ps_fma(auVar30,auVar43,auVar34);
      pfVar2 = pfVar8 + uVar24;
      bVar11 = (bool)((byte)(uVar28 >> 1) & 1);
      bVar12 = (bool)((byte)(uVar28 >> 2) & 1);
      bVar13 = SUB81(uVar28 >> 3,0);
      *pfVar2 = (float)((uint)(bVar10 & 1) * auVar30._0_4_ |
                       (uint)!(bool)(bVar10 & 1) * (int)*pfVar2);
      pfVar2[1] = (float)((uint)bVar11 * auVar30._4_4_ | (uint)!bVar11 * (int)pfVar2[1]);
      pfVar2[2] = (float)((uint)bVar12 * auVar30._8_4_ | (uint)!bVar12 * (int)pfVar2[2]);
      pfVar2[3] = (float)((uint)bVar13 * auVar30._12_4_ | (uint)!bVar13 * (int)pfVar2[3]);
    }
  }
  return;
}

Assistant:

void interpolate_impl(const RTCInterpolateArguments* const args)
    {
      unsigned int primID = args->primID;
      float u = args->u;
      RTCBufferType bufferType = args->bufferType;
      unsigned int bufferSlot = args->bufferSlot;
      float* P = args->P;
      float* dPdu = args->dPdu;
      float* ddPdudu = args->ddPdudu;
      unsigned int valueCount = args->valueCount;
      
      /* calculate base pointer and stride */
      assert((bufferType == RTC_BUFFER_TYPE_VERTEX && bufferSlot < numTimeSteps) ||
             (bufferType == RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE && bufferSlot <= vertexAttribs.size()));
      const char* src = nullptr; 
      size_t stride = 0;
      if (bufferType == RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE) {
        src    = vertexAttribs[bufferSlot].getPtr();
        stride = vertexAttribs[bufferSlot].getStride();
      } else {
        src    = vertices[bufferSlot].getPtr();
        stride = vertices[bufferSlot].getStride();
      }

      for (unsigned int i=0; i<valueCount; i+=N)
      {
        size_t ofs = i*sizeof(float);
        const size_t index = curves[primID];
        const vbool<N> valid = vint<N>((int)i)+vint<N>(step) < vint<N>((int)valueCount);
        const vfloat<N> p0 = mem<vfloat<N>>::loadu(valid,(float*)&src[(index+0)*stride+ofs]);
        const vfloat<N> p1 = mem<vfloat<N>>::loadu(valid,(float*)&src[(index+1)*stride+ofs]);
        const vfloat<N> p2 = mem<vfloat<N>>::loadu(valid,(float*)&src[(index+2)*stride+ofs]);
        const vfloat<N> p3 = mem<vfloat<N>>::loadu(valid,(float*)&src[(index+3)*stride+ofs]);
        
        const Curve<vfloat<N>> curve(p0,p1,p2,p3);
        if (P      ) mem<vfloat<N>>::storeu(valid,P+i,      curve.eval(u));
        if (dPdu   ) mem<vfloat<N>>::storeu(valid,dPdu+i,   curve.eval_du(u));
        if (ddPdudu) mem<vfloat<N>>::storeu(valid,ddPdudu+i,curve.eval_dudu(u));
      }
    }